

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler_unittest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  __pid_t _Var1;
  int iVar2;
  char *local_28;
  char *filename;
  int num_threads;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    fprintf(_stderr,"USAGE: %s <iters> [num_threads] [filename]\n",*argv);
    fprintf(_stderr,"   iters: How many million times to run the XOR test.\n");
    fprintf(_stderr,"   num_threads: how many concurrent threads.\n");
    fprintf(_stderr,"                0 or 1 for single-threaded mode,\n");
    fprintf(_stderr,"                -# to fork instead of thread.\n");
    fprintf(_stderr,"   filename: The name of the output profile.\n");
    fprintf(_stderr,
            "             If you don\'t specify, set CPUPROFILE in the environment instead!\n");
    argv_local._4_4_ = 1;
  }
  else {
    g_iters = atoi(argv[1]);
    filename._4_4_ = 1;
    local_28 = (char *)0x0;
    if (2 < argc) {
      filename._4_4_ = atoi(argv[2]);
    }
    if (3 < argc) {
      local_28 = argv[3];
    }
    if (local_28 != (char *)0x0) {
      ProfilerStart(local_28);
    }
    test_main_thread();
    ProfilerFlush();
    if (filename._4_4_ < 1) {
      for (; filename._4_4_ < 0; filename._4_4_ = filename._4_4_ + 1) {
        if (local_28 != (char *)0x0) {
          printf("FORK test only makes sense when no filename is specified.\n");
          return 2;
        }
        _Var1 = fork();
        if (_Var1 == -1) {
          printf("FORK failed!\n");
          return 1;
        }
        if (_Var1 == 0) {
          iVar2 = execl(*argv,*argv,argv[1],0);
          return iVar2;
        }
        wait((void *)0x0);
      }
    }
    else {
      RunManyThreads(test_other_thread,filename._4_4_);
    }
    test_main_thread();
    if (local_28 != (char *)0x0) {
      ProfilerStop();
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  if ( argc <= 1 ) {
    fprintf(stderr, "USAGE: %s <iters> [num_threads] [filename]\n", argv[0]);
    fprintf(stderr, "   iters: How many million times to run the XOR test.\n");
    fprintf(stderr, "   num_threads: how many concurrent threads.\n");
    fprintf(stderr, "                0 or 1 for single-threaded mode,\n");
    fprintf(stderr, "                -# to fork instead of thread.\n");
    fprintf(stderr, "   filename: The name of the output profile.\n");
    fprintf(stderr, ("             If you don't specify, set CPUPROFILE "
                     "in the environment instead!\n"));
    return 1;
  }

  g_iters = atoi(argv[1]);
  int num_threads = 1;
  const char* filename = nullptr;
  if (argc > 2) {
    num_threads = atoi(argv[2]);
  }
  if (argc > 3) {
    filename = argv[3];
  }

  if (filename) {
    ProfilerStart(filename);
  }

  test_main_thread();

  ProfilerFlush();                           // just because we can

  // The other threads, if any, will run only half as long as the main thread
  if(num_threads > 0) {
    RunManyThreads(test_other_thread, num_threads);
  } else {
  // Or maybe they asked to fork.  The fork test is only interesting
  // when we use CPUPROFILE to name, so check for that
#ifdef HAVE_UNISTD_H
    for (; num_threads < 0; ++num_threads) {   // -<num_threads> to fork
      if (filename) {
        printf("FORK test only makes sense when no filename is specified.\n");
        return 2;
      }
      switch (fork()) {
        case -1:
          printf("FORK failed!\n");
          return 1;
        case 0:             // child
          return execl(argv[0], argv[0], argv[1], nullptr);
        default:
          wait(nullptr);       // we'll let the kids run one at a time
      }
    }
#else
    fprintf(stderr, "%s was compiled without support for fork() and exec()\n", argv[0]);
#endif
  }

  test_main_thread();

  if (filename) {
    ProfilerStop();
  }

  return 0;
}